

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# charconv_bigint.h
# Opt level: O2

void __thiscall
absl::lts_20250127::strings_internal::BigUnsigned<84>::ShiftLeft(BigUnsigned<84> *this,int count)

{
  byte bVar1;
  ulong uVar2;
  uint uVar3;
  int iVar4;
  long lVar5;
  size_t __n;
  int iVar6;
  int iVar7;
  long lVar8;
  
  if (0 < count) {
    if (0xa7f < (uint)count) {
      SetToZero(this);
      return;
    }
    uVar3 = (uint)count >> 5;
    uVar2 = (ulong)uVar3;
    iVar6 = this->size_ + uVar3;
    iVar4 = 0x54;
    if (iVar6 < 0x54) {
      iVar4 = iVar6;
    }
    this->size_ = iVar4;
    if ((count & 0x1fU) == 0) {
      lVar8 = (long)iVar4 * 4 + 4;
      lVar5 = lVar8 - (ulong)(uVar3 * 4);
      if (lVar5 != 4) {
        __n = lVar5 - 4;
        memmove((void *)((long)this + (lVar8 - __n)),this->words_,__n);
      }
    }
    else {
      iVar7 = 0x53;
      if (iVar6 < 0x53) {
        iVar7 = iVar6;
      }
      for (lVar8 = (long)iVar7; (long)uVar2 < lVar8; lVar8 = lVar8 + -1) {
        bVar1 = (byte)count & 0x1f;
        this->words_[lVar8] =
             *(int *)((long)this + lVar8 * 4 + (4 - (ulong)(uVar3 * 4))) << bVar1 |
             *(uint *)((long)this + (lVar8 * 4 - (ulong)(uVar3 * 4))) >> 0x20 - bVar1;
      }
      this->words_[uVar2] = this->words_[0] << (sbyte)(count & 0x1fU);
      if ((iVar6 < 0x54) && (this->words_[iVar4] != 0)) {
        this->size_ = iVar4 + 1;
      }
    }
    std::__fill_n_a<unsigned_int*,int,unsigned_int>(this->words_,uVar2);
  }
  return;
}

Assistant:

void ShiftLeft(int count) {
    if (count > 0) {
      const int word_shift = count / 32;
      if (word_shift >= max_words) {
        SetToZero();
        return;
      }
      size_ = (std::min)(size_ + word_shift, max_words);
      count %= 32;
      if (count == 0) {
// https://gcc.gnu.org/bugzilla/show_bug.cgi?id=warray-bounds
// shows a lot of bogus -Warray-bounds warnings under GCC.
// This is not the only one in Abseil.
#if ABSL_INTERNAL_HAVE_MIN_GNUC_VERSION(14, 0)
#pragma GCC diagnostic push
#pragma GCC diagnostic ignored "-Warray-bounds"
#endif
        std::copy_backward(words_, words_ + size_ - word_shift, words_ + size_);
#if ABSL_INTERNAL_HAVE_MIN_GNUC_VERSION(14, 0)
#pragma GCC diagnostic pop
#endif
      } else {
        for (int i = (std::min)(size_, max_words - 1); i > word_shift; --i) {
          words_[i] = (words_[i - word_shift] << count) |
                      (words_[i - word_shift - 1] >> (32 - count));
        }
        words_[word_shift] = words_[0] << count;
        // Grow size_ if necessary.
        if (size_ < max_words && words_[size_]) {
          ++size_;
        }
      }
      std::fill_n(words_, word_shift, 0u);
    }
  }